

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O1

el_action_t cv_paste(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  ulong __n;
  el_action_t eVar2;
  
  pwVar1 = (el->el_chared).c_kill.buf;
  __n = (long)(el->el_chared).c_kill.last - (long)pwVar1;
  eVar2 = '\x06';
  if (pwVar1 != (wchar_t *)0x0 && __n != 0) {
    cv_undo(el);
    if ((c == 0) && (pwVar1 = (el->el_line).cursor, pwVar1 < (el->el_line).lastchar)) {
      (el->el_line).cursor = pwVar1 + 1;
    }
    c_insert(el,(wchar_t)(__n >> 2));
    pwVar1 = (el->el_line).cursor;
    if ((wchar_t *)((long)pwVar1 + __n) <= (el->el_line).lastchar) {
      memcpy(pwVar1,(el->el_chared).c_kill.buf,__n);
      eVar2 = '\x04';
    }
  }
  return eVar2;
}

Assistant:

static el_action_t
cv_paste(EditLine *el, wint_t c)
{
	c_kill_t *k = &el->el_chared.c_kill;
	size_t len = (size_t)(k->last - k->buf);

	if (k->buf == NULL || len == 0)
		return CC_ERROR;
#ifdef DEBUG_PASTE
	(void) fprintf(el->el_errfile, "Paste: \"%.*ls\"\n", (int)len,
	    k->buf);
#endif

	cv_undo(el);

	if (!c && el->el_line.cursor < el->el_line.lastchar)
		el->el_line.cursor++;

	c_insert(el, (int)len);
	if (el->el_line.cursor + len > el->el_line.lastchar)
		return CC_ERROR;
	(void) memcpy(el->el_line.cursor, k->buf, len *
	    sizeof(*el->el_line.cursor));

	return CC_REFRESH;
}